

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O3

void __thiscall
el::base::TypedConfigurations::build(TypedConfigurations *this,Configurations *configurations)

{
  ConfigurationType CVar1;
  Level LVar2;
  pointer pcVar3;
  long lVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  unsigned_long uVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  _Alloc_hider _Var9;
  Configuration **ppCVar10;
  bool bVar11;
  vector<el::Configuration_*,_std::allocator<el::Configuration_*>_> withFileSizeLimit;
  Configuration *conf;
  Configuration **local_218;
  iterator iStack_210;
  Configuration **local_208;
  TypedConfigurations *local_200;
  Configuration *local_1f8;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  map<el::Level,_unsigned_long,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
  *local_170;
  map<el::Level,_el::base::MillisecondsWidth,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_el::base::MillisecondsWidth>_>_>
  *local_168;
  map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
  *local_160;
  map<el::Level,_unsigned_long,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
  *local_158;
  map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
  *local_150;
  map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
  *local_148;
  map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
  *local_140;
  map<el::Level,_el::base::LogFormat,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_el::base::LogFormat>_>_>
  *local_138;
  long *local_130;
  string local_128;
  string local_108;
  string local_e8;
  string_t local_c8;
  undefined8 local_a8;
  undefined8 local_a0;
  code *local_98;
  code *local_90;
  long *plVar6;
  
  (*(this->super_ThreadSafe)._vptr_ThreadSafe[2])();
  local_218 = (Configuration **)0x0;
  iStack_210._M_current = (Configuration **)0x0;
  local_208 = (Configuration **)0x0;
  iVar5 = (*(configurations->super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>
            ).
            super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
            .super_ThreadSafe._vptr_ThreadSafe[5])(configurations);
  plVar6 = (long *)CONCAT44(extraout_var,iVar5);
  local_158 = &this->m_maxLogFileSizeMap;
  local_160 = &this->m_performanceTrackingMap;
  local_168 = &this->m_millisecondsWidthMap;
  local_138 = &this->m_logFormatMap;
  local_170 = &this->m_logFlushThresholdMap;
  local_140 = &this->m_toStandardOutputMap;
  local_148 = &this->m_toFileMap;
  local_150 = &this->m_enabledMap;
  local_200 = this;
  do {
    iVar5 = (*(configurations->
              super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>).
              super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
              .super_ThreadSafe._vptr_ThreadSafe[6])(configurations);
    if (plVar6 == (long *)CONCAT44(extraout_var_00,iVar5)) {
      iVar5 = (*(configurations->
                super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>).
                super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                .super_ThreadSafe._vptr_ThreadSafe[5])(configurations);
      for (plVar6 = (long *)CONCAT44(extraout_var_01,iVar5);
          iVar5 = (*(configurations->
                    super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>).
                    super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                    .super_ThreadSafe._vptr_ThreadSafe[6])(configurations),
          plVar6 != (long *)CONCAT44(extraout_var_02,iVar5); plVar6 = plVar6 + 1) {
        lVar4 = *plVar6;
        if (*(short *)(lVar4 + 10) == 0x10) {
          insertFile(this,*(Level *)(lVar4 + 8),(string *)(lVar4 + 0x10));
        }
      }
      if (local_218 != iStack_210._M_current) {
        ppCVar10 = local_218;
        do {
          local_a0 = 0;
          local_a8 = defaultPreRollOutCallback;
          local_90 = std::
                     _Function_handler<void_(const_char_*,_unsigned_long),_void_(*)(const_char_*,_unsigned_long)>
                     ::_M_invoke;
          local_98 = std::
                     _Function_handler<void_(const_char_*,_unsigned_long),_void_(*)(const_char_*,_unsigned_long)>
                     ::_M_manager;
          unsafeValidateFileRolling(this,(*ppCVar10)->m_level,(PreRollOutCallback *)&local_a8);
          if (local_98 != (code *)0x0) {
            (*local_98)((PreRollOutCallback *)&local_a8,(PreRollOutCallback *)&local_a8,3);
          }
          ppCVar10 = ppCVar10 + 1;
        } while (ppCVar10 != iStack_210._M_current);
      }
      if (local_218 != (Configuration **)0x0) {
        operator_delete(local_218);
      }
      return;
    }
    local_1f8 = (Configuration *)*plVar6;
    CVar1 = local_1f8->m_configurationType;
    if ((Filename|Format|ToStandardOutput|ToFile|Enabled) < CVar1) {
      if ((PerformanceTracking|MillisecondsWidth|Filename|Format|ToStandardOutput|ToFile|Enabled) <
          CVar1) {
        if (CVar1 == MaxLogFileSize) {
          LVar2 = local_1f8->m_level;
          local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
          pcVar3 = (local_1f8->m_value)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_108,pcVar3,pcVar3 + (local_1f8->m_value)._M_string_length);
          local_a8 = (code *)getULong(this,&local_108);
          setValue<unsigned_long>(this,LVar2,&local_a8,local_158,true);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p);
          }
          if (iStack_210._M_current == local_208) {
            std::vector<el::Configuration*,std::allocator<el::Configuration*>>::
            _M_realloc_insert<el::Configuration*const&>
                      ((vector<el::Configuration*,std::allocator<el::Configuration*>> *)&local_218,
                       iStack_210,&local_1f8);
          }
          else {
            *iStack_210._M_current = local_1f8;
            iStack_210._M_current = iStack_210._M_current + 1;
          }
        }
        else if (CVar1 == LogFlushThreshold) {
          LVar2 = local_1f8->m_level;
          local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
          pcVar3 = (local_1f8->m_value)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_128,pcVar3,pcVar3 + (local_1f8->m_value)._M_string_length);
          local_a8 = (code *)getULong(this,&local_128);
          setValue<unsigned_long>(this,LVar2,&local_a8,local_170,true);
          paVar8 = &local_128.field_2;
          _Var9._M_p = local_128._M_dataplus._M_p;
          goto LAB_00119e5f;
        }
        goto switchD_001198d3_caseD_3;
      }
      if (CVar1 == MillisecondsWidth) {
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        pcVar3 = (local_1f8->m_value)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_e8,pcVar3,pcVar3 + (local_1f8->m_value)._M_string_length);
        uVar7 = getULong(this,&local_e8);
        local_a8._0_4_ = (int)uVar7;
        if ((int)local_a8 - 7U < 0xfffffffa) {
          local_a8._0_4_ = 3;
        }
        local_a8._4_4_ = 1000;
        if ((int)local_a8 - 4U < 3) {
          local_a8._4_4_ = *(uint *)(&DAT_00121cc0 + (ulong)((int)local_a8 - 4U) * 4);
        }
        setValue<el::base::MillisecondsWidth>
                  (this,Global,(MillisecondsWidth *)&local_a8,local_168,true);
        paVar8 = &local_e8.field_2;
        _Var9._M_p = local_e8._M_dataplus._M_p;
        goto LAB_00119e5f;
      }
      if (CVar1 != PerformanceTracking) goto switchD_001198d3_caseD_3;
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      pcVar3 = (local_1f8->m_value)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1f0,pcVar3,pcVar3 + (local_1f8->m_value)._M_string_length);
      utils::Str::trim(&local_1f0);
      iVar5 = std::__cxx11::string::compare((char *)&local_1f0);
      bVar11 = true;
      if ((iVar5 != 0) && (iVar5 = std::__cxx11::string::compare((char *)&local_1f0), iVar5 != 0)) {
        iVar5 = std::__cxx11::string::compare((char *)&local_1f0);
        bVar11 = iVar5 == 0;
      }
      local_a8._0_1_ = bVar11;
      setValue<bool>(this,Global,(bool *)&local_a8,local_160,true);
      _Var9._M_p = local_1f0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p == &local_1f0.field_2) goto switchD_001198d3_caseD_3;
      goto LAB_00119e64;
    }
    switch(CVar1) {
    case Enabled:
      LVar2 = local_1f8->m_level;
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      pcVar3 = (local_1f8->m_value)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_190,pcVar3,pcVar3 + (local_1f8->m_value)._M_string_length);
      utils::Str::trim(&local_190);
      iVar5 = std::__cxx11::string::compare((char *)&local_190);
      bVar11 = true;
      if ((iVar5 != 0) && (iVar5 = std::__cxx11::string::compare((char *)&local_190), iVar5 != 0)) {
        iVar5 = std::__cxx11::string::compare((char *)&local_190);
        bVar11 = iVar5 == 0;
      }
      local_a8._0_1_ = bVar11;
      setValue<bool>(local_200,LVar2,(bool *)&local_a8,local_150,true);
      this = local_200;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p);
        this = local_200;
      }
      break;
    case ToFile:
      LVar2 = local_1f8->m_level;
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
      pcVar3 = (local_1f8->m_value)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1b0,pcVar3,pcVar3 + (local_1f8->m_value)._M_string_length);
      utils::Str::trim(&local_1b0);
      iVar5 = std::__cxx11::string::compare((char *)&local_1b0);
      bVar11 = true;
      if ((iVar5 != 0) && (iVar5 = std::__cxx11::string::compare((char *)&local_1b0), iVar5 != 0)) {
        iVar5 = std::__cxx11::string::compare((char *)&local_1b0);
        bVar11 = iVar5 == 0;
      }
      local_a8._0_1_ = bVar11;
      setValue<bool>(this,LVar2,(bool *)&local_a8,local_148,true);
      paVar8 = &local_1b0.field_2;
      _Var9._M_p = local_1b0._M_dataplus._M_p;
      goto LAB_00119e5f;
    case ToStandardOutput:
      LVar2 = local_1f8->m_level;
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      pcVar3 = (local_1f8->m_value)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d0,pcVar3,pcVar3 + (local_1f8->m_value)._M_string_length);
      utils::Str::trim(&local_1d0);
      iVar5 = std::__cxx11::string::compare((char *)&local_1d0);
      bVar11 = true;
      if ((iVar5 != 0) && (iVar5 = std::__cxx11::string::compare((char *)&local_1d0), iVar5 != 0)) {
        iVar5 = std::__cxx11::string::compare((char *)&local_1d0);
        bVar11 = iVar5 == 0;
      }
      local_a8._0_1_ = bVar11;
      setValue<bool>(this,LVar2,(bool *)&local_a8,local_140,true);
      paVar8 = &local_1d0.field_2;
      _Var9._M_p = local_1d0._M_dataplus._M_p;
LAB_00119e5f:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var9._M_p != paVar8) {
LAB_00119e64:
        operator_delete(_Var9._M_p);
      }
      break;
    case Format:
      LVar2 = local_1f8->m_level;
      pcVar3 = (local_1f8->m_value)._M_dataplus._M_p;
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      local_130 = plVar6;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&local_c8,pcVar3,pcVar3 + (local_1f8->m_value)._M_string_length);
      LogFormat::LogFormat((LogFormat *)&local_a8,LVar2,&local_c8);
      setValue<el::base::LogFormat>(this,LVar2,(LogFormat *)&local_a8,local_138,true);
      LogFormat::~LogFormat((LogFormat *)&local_a8);
      plVar6 = local_130;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p);
        plVar6 = local_130;
      }
    }
switchD_001198d3_caseD_3:
    plVar6 = plVar6 + 1;
  } while( true );
}

Assistant:

void build(Configurations* configurations) {
        base::threading::ScopedLock scopedLock(lock());
        auto getBool = [] (std::string boolStr) -> bool {  // Pass by value for trimming
            base::utils::Str::trim(boolStr);
            return (boolStr == "TRUE" || boolStr == "true" || boolStr == "1");
        };
        std::vector<Configuration*> withFileSizeLimit;
        for (Configurations::const_iterator it = configurations->begin(); it != configurations->end(); ++it) {
            Configuration* conf = *it;
            // We cannot use switch on strong enums because Intel C++ dont support them yet
            if (conf->configurationType() == ConfigurationType::Enabled) {
                setValue(conf->level(), getBool(conf->value()), &m_enabledMap);
            } else if (conf->configurationType() == ConfigurationType::ToFile) {
                setValue(conf->level(), getBool(conf->value()), &m_toFileMap);
            } else if (conf->configurationType() == ConfigurationType::ToStandardOutput) {
                setValue(conf->level(), getBool(conf->value()), &m_toStandardOutputMap);
            } else if (conf->configurationType() == ConfigurationType::Filename) {
            // We do not yet configure filename but we will configure in another
            // loop. This is because if file cannot be created, we will force ToFile
            // to be false. Because configuring logger is not necessarily performance
            // sensative operation, we can live with another loop; (by the way this loop
            // is not very heavy either)
            } else if (conf->configurationType() == ConfigurationType::Format) {
                setValue(conf->level(), base::LogFormat(conf->level(), 
                    base::type::string_t(conf->value().begin(), conf->value().end())), &m_logFormatMap);
            } else if (conf->configurationType() == ConfigurationType::MillisecondsWidth) {
                setValue(Level::Global, 
                    base::MillisecondsWidth(static_cast<int>(getULong(conf->value()))), &m_millisecondsWidthMap);
            } else if (conf->configurationType() == ConfigurationType::PerformanceTracking) {
                setValue(Level::Global, getBool(conf->value()), &m_performanceTrackingMap);
            } else if (conf->configurationType() == ConfigurationType::MaxLogFileSize) {
                setValue(conf->level(), static_cast<std::size_t>(getULong(conf->value())), &m_maxLogFileSizeMap);
#if !defined(ELPP_NO_DEFAULT_LOG_FILE)
                withFileSizeLimit.push_back(conf);
#endif  // !defined(ELPP_NO_DEFAULT_LOG_FILE)
            } else if (conf->configurationType() == ConfigurationType::LogFlushThreshold) {
                setValue(conf->level(), static_cast<std::size_t>(getULong(conf->value())), &m_logFlushThresholdMap);
            }
        }
        // As mentioned early, we will now set filename configuration in separate loop to deal with non-existent files
        for (Configurations::const_iterator it = configurations->begin(); it != configurations->end(); ++it) {
            Configuration* conf = *it;
            if (conf->configurationType() == ConfigurationType::Filename) {
                insertFile(conf->level(), conf->value());
            }
        }
        for (std::vector<Configuration*>::iterator conf = withFileSizeLimit.begin();
                conf != withFileSizeLimit.end(); ++conf) {
                // This is not unsafe as mutex is locked in currect scope
                unsafeValidateFileRolling((*conf)->level(), base::defaultPreRollOutCallback);
        }
    }